

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

int cd_integer_init(parser_info *info,char **attr)

{
  int iVar1;
  coda_type_number *pcVar2;
  char **attr_local;
  parser_info *info_local;
  
  iVar1 = handle_format_attribute_for_type(info,attr);
  if (iVar1 == 0) {
    info->node->free_data = coda_type_release;
    pcVar2 = coda_type_number_new(info->node->format,coda_integer_class);
    info->node->data = pcVar2;
    if (info->node->data == (void *)0x0) {
      info_local._4_4_ = -1;
    }
    else {
      iVar1 = handle_name_attribute_for_type(info,attr);
      if (iVar1 == 0) {
        register_sub_element
                  (info->node,element_cd_description,string_data_init,type_set_description);
        register_sub_element(info->node,element_cd_unit,string_data_init,cd_integer_set_unit);
        register_sub_element
                  (info->node,element_cd_byte_size,integer_constant_or_expression_init,
                   type_set_byte_size);
        register_sub_element
                  (info->node,element_cd_bit_size,integer_constant_or_expression_init,
                   type_set_bit_size);
        register_sub_element
                  (info->node,element_cd_little_endian,dummy_init,cd_integer_set_little_endian);
        register_sub_element
                  (info->node,element_cd_native_type,cd_native_type_init,cd_integer_set_read_type);
        register_sub_element
                  (info->node,element_cd_conversion,cd_conversion_init,cd_integer_set_conversion);
        register_sub_element(info->node,element_cd_mapping,cd_mapping_init,cd_integer_add_mapping);
        register_sub_element(info->node,element_cd_attribute,cd_attribute_init,type_add_attribute);
        info->node->finalise_element = cd_integer_finalise;
        info_local._4_4_ = 0;
      }
      else {
        info_local._4_4_ = -1;
      }
    }
  }
  else {
    info_local._4_4_ = -1;
  }
  return info_local._4_4_;
}

Assistant:

static int cd_integer_init(parser_info *info, const char **attr)
{
    if (handle_format_attribute_for_type(info, attr) != 0)
    {
        return -1;
    }
    info->node->free_data = (free_data_handler)coda_type_release;
    info->node->data = coda_type_number_new(info->node->format, coda_integer_class);
    if (info->node->data == NULL)
    {
        return -1;
    }
    if (handle_name_attribute_for_type(info, attr) != 0)
    {
        return -1;
    }

    register_sub_element(info->node, element_cd_description, string_data_init, type_set_description);
    register_sub_element(info->node, element_cd_unit, string_data_init, cd_integer_set_unit);
    register_sub_element(info->node, element_cd_byte_size, integer_constant_or_expression_init, type_set_byte_size);
    register_sub_element(info->node, element_cd_bit_size, integer_constant_or_expression_init, type_set_bit_size);
    register_sub_element(info->node, element_cd_little_endian, dummy_init, cd_integer_set_little_endian);
    register_sub_element(info->node, element_cd_native_type, cd_native_type_init, cd_integer_set_read_type);
    register_sub_element(info->node, element_cd_conversion, cd_conversion_init, cd_integer_set_conversion);
    register_sub_element(info->node, element_cd_mapping, cd_mapping_init, cd_integer_add_mapping);
    register_sub_element(info->node, element_cd_attribute, cd_attribute_init, type_add_attribute);
    info->node->finalise_element = cd_integer_finalise;

    return 0;
}